

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O2

void CVmBifTIO::banner_get_info(uint argc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  vm_obj_id_t obj;
  void *pvVar4;
  CVmConsoleBanner *this;
  CVmObjPageEntry *lst;
  os_banner_info_t info;
  
  CVmBif::check_argc(argc,1);
  iVar3 = CVmBif::pop_int_val();
  pvVar4 = CVmBannerManager::get_os_handle(G_console_X->banner_manager_,iVar3);
  this = (CVmConsoleBanner *)
         CVmHandleManager::get_object(&G_console_X->banner_manager_->super_CVmHandleManager,iVar3);
  if ((pvVar4 != (void *)0x0) && (this != (CVmConsoleBanner *)0x0)) {
    iVar3 = CVmConsoleBanner::get_banner_info(this,&info);
    if (iVar3 == 0) {
      CVmBif::retval_nil();
    }
    else {
      obj = CVmObjList::create(0,6);
      pvVar2 = sp_;
      lst = G_obj_table_X.pages_[obj >> 0xc] + (obj & 0xfff);
      pvVar1 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar1 = VM_OBJ;
      (pvVar2->val).obj = obj;
      set_list_int((CVmObjList *)lst,0,(long)info.align);
      set_list_int((CVmObjList *)lst,1,info.style);
      set_list_int((CVmObjList *)lst,2,(long)info.rows);
      set_list_int((CVmObjList *)lst,3,(long)info.columns);
      set_list_int((CVmObjList *)lst,4,(long)info.pix_height);
      set_list_int((CVmObjList *)lst,5,(long)info.pix_width);
      CVmBif::retval_obj(obj);
      sp_ = sp_ + -1;
    }
    return;
  }
  err_throw(0x902);
}

Assistant:

void CVmBifTIO::banner_get_info(VMG_ uint argc)
{
    int id;
    void *hdl;
    os_banner_info_t info;
    CVmConsoleBanner *console;

    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* get the banner ID */
    id = pop_int_val(vmg0_);

    /* get the banner - if it's invalid, throw an error */
    hdl = G_console->get_banner_manager()->get_os_handle(id);
    console = G_console->get_banner_manager()->get_console(id);
    if (hdl == 0 || console == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* get information on the banner */
    if (console->get_banner_info(&info))
    {
        vm_obj_id_t lst_obj;
        CVmObjList *lst;
        vm_val_t val;
        
        /* set up a return list with space for six entries */
        lst_obj = CVmObjList::create(vmg_ FALSE, 6);
        lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

        /* save the list on the stack to protect against garbage collection */
        val.set_obj(lst_obj);
        G_stk->push(&val);

        /* 
         *   return the values: [align, style, rows, columns, pix_height,
         *   pix_width] 
         */
        set_list_int(lst, 0, info.align);
        set_list_int(lst, 1, info.style);
        set_list_int(lst, 2, info.rows);
        set_list_int(lst, 3, info.columns);
        set_list_int(lst, 4, info.pix_height);
        set_list_int(lst, 5, info.pix_width);

        /* return the list */
        retval_obj(vmg_ lst_obj);

        /* discard our gc protection */
        G_stk->discard();
    }
    else
    {
        /* no information available - return nil */
        retval_nil(vmg0_);
    }